

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestReferenceCounting::initXFB(TextureViewTestReferenceCounting *this)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x277e);
  iVar2 = *(int *)&(this->m_mipmap_colors).
                   super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar1 = *(int *)&(this->m_mipmap_colors).
                   super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2785);
  (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2788);
  (**(code **)(lVar4 + 0x150))(0x8c8e,(long)(iVar2 - iVar1) & 0xfffffffffffffffc,0,0x88e4);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x278c);
  return;
}

Assistant:

void TextureViewTestReferenceCounting::initXFB()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Sanity checks */
	DE_ASSERT(m_po_id != 0);

	/* Generate a buffer object we'll use for Transform Feedback */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	/* Set up buffer object storage. We need it to be large enough to hold
	 * sizeof(glw::GLint) per mipmap level */
	const glw::GLint bo_size = (glw::GLint)(sizeof(glw::GLint) * m_mipmap_colors.size());

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, /* data */
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");
}